

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall irr::video::CNullDriver::~CNullDriver(CNullDriver *this,void **vtt)

{
  s32 *psVar1;
  int *piVar2;
  _func_int **pp_Var3;
  IAttributes *pIVar4;
  _func_int *p_Var5;
  IFileSystem *pIVar6;
  IMeshManipulator *pIVar7;
  IImageLoader *pIVar8;
  IImageWriter *pIVar9;
  void *pvVar10;
  pointer pSVar11;
  _List_node_base *p_Var12;
  pointer ppIVar13;
  pointer ppIVar14;
  _List_node_base *p_Var15;
  pointer ppIVar16;
  pointer ppIVar17;
  long lVar18;
  ulong uVar19;
  
  pp_Var3 = (_func_int **)*vtt;
  (this->super_IVideoDriver)._vptr_IVideoDriver = pp_Var3;
  *(void **)((long)&(this->super_IVideoDriver)._vptr_IVideoDriver + (long)pp_Var3[-3]) = vtt[3];
  *(undefined8 *)&(this->super_IVideoDriver).field_0x8 = 0x265fd0;
  pIVar4 = this->DriverAttributes;
  if (pIVar4 != (IAttributes *)0x0) {
    p_Var5 = pIVar4->_vptr_IAttributes[-3];
    piVar2 = (int *)(&pIVar4->field_0x10 + (long)p_Var5);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (**(code **)(*(long *)((long)&pIVar4->_vptr_IAttributes + (long)p_Var5) + 8))();
    }
  }
  pIVar6 = this->FileSystem;
  if (pIVar6 != (IFileSystem *)0x0) {
    p_Var5 = pIVar6->_vptr_IFileSystem[-3];
    piVar2 = (int *)(&pIVar6->field_0x10 + (long)p_Var5);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (**(code **)(*(long *)((long)&pIVar6->_vptr_IFileSystem + (long)p_Var5) + 8))();
    }
  }
  pIVar7 = this->MeshManipulator;
  if (pIVar7 != (IMeshManipulator *)0x0) {
    p_Var5 = pIVar7->_vptr_IMeshManipulator[-3];
    piVar2 = (int *)(&pIVar7->field_0x10 + (long)p_Var5);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (**(code **)(*(long *)((long)&pIVar7->_vptr_IMeshManipulator + (long)p_Var5) + 8))();
    }
  }
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x24])(this);
  deleteAllTextures(this);
  ppIVar16 = (this->SurfaceLoader).m_data.
             super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->SurfaceLoader).m_data.
             super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 & 0x7fffffff8U) != 0) {
    uVar19 = 0;
    do {
      pIVar8 = ppIVar16[uVar19];
      p_Var5 = pIVar8->_vptr_IImageLoader[0xfffffffffffffffd];
      piVar2 = (int *)(&pIVar8->field_0x10 + (long)p_Var5);
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (**(code **)(*(long *)((long)&pIVar8->_vptr_IImageLoader + (long)p_Var5) + 8))();
      }
      uVar19 = uVar19 + 1;
      ppIVar16 = (this->SurfaceLoader).m_data.
                 super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < ((ulong)((long)(this->SurfaceLoader).m_data.
                                     super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16) >>
                       3 & 0xffffffff));
  }
  ppIVar17 = (this->SurfaceWriter).m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->SurfaceWriter).m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar17 & 0x7fffffff8U) != 0) {
    uVar19 = 0;
    do {
      pIVar9 = ppIVar17[uVar19];
      psVar1 = &(pIVar9->super_IReferenceCounted).ReferenceCounter;
      *psVar1 = *psVar1 + -1;
      if (*psVar1 == 0) {
        (**(code **)((long)(pIVar9->super_IReferenceCounted)._vptr_IReferenceCounted + 8))();
      }
      uVar19 = uVar19 + 1;
      ppIVar17 = (this->SurfaceWriter).m_data.
                 super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < ((ulong)((long)(this->SurfaceWriter).m_data.
                                     super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar17) >>
                       3 & 0xffffffff));
  }
  deleteMaterialRenders(this);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x19])(this);
  lVar18 = 0;
  do {
    pvVar10 = *(void **)((long)&(this->InitMaterial2D).TextureLayers[3].TextureMatrix + lVar18);
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,0x40);
    }
    lVar18 = lVar18 + -0x20;
  } while (lVar18 != -0x80);
  lVar18 = 0;
  do {
    pvVar10 = *(void **)((long)&(this->OverrideMaterial2D).TextureLayers[3].TextureMatrix + lVar18);
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,0x40);
    }
    lVar18 = lVar18 + -0x20;
  } while (lVar18 != -0x80);
  pSVar11 = (this->OverrideMaterial).MaterialTypes.m_data.
            super__Vector_base<irr::video::SOverrideMaterial::SMaterialTypeReplacement,_std::allocator<irr::video::SOverrideMaterial::SMaterialTypeReplacement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar11 != (pointer)0x0) {
    operator_delete(pSVar11,(long)(this->OverrideMaterial).MaterialTypes.m_data.
                                  super__Vector_base<irr::video::SOverrideMaterial::SMaterialTypeReplacement,_std::allocator<irr::video::SOverrideMaterial::SMaterialTypeReplacement>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar11
                   );
  }
  lVar18 = 0;
  do {
    pvVar10 = *(void **)((long)&(this->OverrideMaterial).Material.TextureLayers[3].TextureMatrix +
                        lVar18);
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,0x40);
    }
    lVar18 = lVar18 + -0x20;
  } while (lVar18 != -0x80);
  p_Var15 = (this->HWBufferList).
            super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var15 != (_List_node_base *)&this->HWBufferList) {
    p_Var12 = p_Var15->_M_next;
    operator_delete(p_Var15,0x18);
    p_Var15 = p_Var12;
  }
  std::
  vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ::~vector(&(this->MaterialRenderers).m_data);
  ppIVar17 = (this->SurfaceWriter).m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar17 != (pointer)0x0) {
    operator_delete(ppIVar17,(long)(this->SurfaceWriter).m_data.
                                   super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar17);
  }
  ppIVar16 = (this->SurfaceLoader).m_data.
             super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar16 != (pointer)0x0) {
    operator_delete(ppIVar16,(long)(this->SurfaceLoader).m_data.
                                   super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar16);
  }
  ppIVar13 = (this->SharedDepthTextures).m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar13 != (pointer)0x0) {
    operator_delete(ppIVar13,(long)(this->SharedDepthTextures).m_data.
                                   super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar13);
  }
  ppIVar14 = (this->RenderTargets).m_data.
             super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar14 != (pointer)0x0) {
    operator_delete(ppIVar14,(long)(this->RenderTargets).m_data.
                                   super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar14);
  }
  std::
  vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>::
  ~vector(&(this->OcclusionQueries).m_data);
  pvVar10 = *(void **)&(this->super_IVideoDriver).field_0x10;
  if (pvVar10 == (void *)0x0) {
    return;
  }
  operator_delete(pvVar10,*(long *)&this->field_0x20 - (long)pvVar10);
  return;
}

Assistant:

CNullDriver::~CNullDriver()
{
	if (DriverAttributes)
		DriverAttributes->drop();

	if (FileSystem)
		FileSystem->drop();

	if (MeshManipulator)
		MeshManipulator->drop();

	removeAllRenderTargets();

	deleteAllTextures();

	u32 i;
	for (i = 0; i < SurfaceLoader.size(); ++i)
		SurfaceLoader[i]->drop();

	for (i = 0; i < SurfaceWriter.size(); ++i)
		SurfaceWriter[i]->drop();

	// delete material renderers
	deleteMaterialRenders();

	// delete hardware mesh buffers
	removeAllHardwareBuffers();
}